

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall
Inline::TryGetCallApplyCallbackTargetInlineeData
          (Inline *this,FunctionJITTimeInfo *inlinerData,Instr *callInstr,Instr *callApplyLdInstr,
          FunctionJITTimeInfo **inlineeData,Instr **callbackDefInstr,bool isCallInstanceFunction)

{
  ushort profileId;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Instr *this_00;
  ProfiledInstr *pPVar4;
  FunctionJITTimeInfo *pFVar5;
  JITTimeFunctionBody *this_01;
  char16 *pcVar6;
  char16 *pcVar7;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  if (isCallInstanceFunction) {
    this_00 = TryGetCallbackDefInstrForCallInstanceFunction(this,callInstr);
  }
  else {
    this_00 = TryGetCallbackDefInstrForCallApplyTarget(this,callApplyLdInstr);
  }
  *callbackDefInstr = this_00;
  if (this_00 != (Instr *)0x0) {
    pPVar4 = IR::Instr::AsProfiledInstr(this_00);
    profileId = (pPVar4->u).field_3.fldInfoData.f1;
    pFVar5 = JITTimeWorkItem::GetJITTimeInfo((*callbackDefInstr)->m_func->m_workItem);
    pFVar5 = FunctionJITTimeInfo::GetCallbackInlinee(pFVar5,profileId);
    *inlineeData = pFVar5;
    uVar2 = Func::GetSourceContextId(this->topFunc);
    uVar3 = Func::GetLocalFunctionId(this->topFunc);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlineCallbacksPhase,uVar2,uVar3);
    if (!bVar1) {
      uVar2 = Func::GetSourceContextId(this->topFunc);
      uVar3 = Func::GetLocalFunctionId(this->topFunc);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,InlineCallbacksPhase,uVar2,uVar3);
      if (!bVar1) goto LAB_0050a286;
    }
    this_01 = FunctionJITTimeInfo::GetBody(inlinerData);
    pcVar6 = JITTimeFunctionBody::GetDisplayName(this_01);
    pcVar7 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_98);
    Output::Print(L"INLINING : Found callback def instr for call/apply target callback at\tCallSite: %d\tCaller: %s (%s)\n"
                  ,(ulong)profileId,pcVar6,pcVar7);
    Output::Flush();
  }
LAB_0050a286:
  return this_00 != (Instr *)0x0;
}

Assistant:

bool
Inline::TryGetCallApplyCallbackTargetInlineeData(
    const FunctionJITTimeInfo* inlinerData,
    IR::Instr * callInstr,
    IR::Instr * callApplyLdInstr,
    const FunctionJITTimeInfo ** inlineeData,
    IR::Instr ** callbackDefInstr,
    bool isCallInstanceFunction)
{
    // Try to find a callback def instr for the method.
    if (isCallInstanceFunction)
    {
        *callbackDefInstr = TryGetCallbackDefInstrForCallInstanceFunction(callInstr);
    }
    else
    {
        *callbackDefInstr = TryGetCallbackDefInstrForCallApplyTarget(callApplyLdInstr);
    }

    if (*callbackDefInstr == nullptr)
    {
        return false;
    }

    Js::ProfileId callSiteId = static_cast<Js::ProfileId>((*callbackDefInstr)->AsProfiledInstr()->u.profileId);
    *inlineeData = (*callbackDefInstr)->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallbackInlinee(callSiteId);

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    INLINE_CALLBACKS_TRACE(_u("INLINING : Found callback def instr for call/apply target callback at\tCallSite: %d\tCaller: %s (%s)\n"),
        callSiteId, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
#endif

    return true;
}